

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::internal::
ComparisonBase<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::AnyEq>
::
Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Impl(Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  pointer pcVar1;
  
  (this->
  super_MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Impl_00163c30;
  pcVar1 = (this->rhs_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->rhs_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit Impl(const Rhs& rhs) : rhs_(rhs) {}